

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000084;
  ulong local_58;
  size_t num_bytes_resulting;
  ulong uStack_48;
  char c;
  size_t i;
  size_t bytes_out;
  size_t in_len_local;
  uint8_t *in_local;
  int *out_len_local;
  uint8_t *out_local;
  EVP_ENCODE_CTX *ctx_local;
  
  bytes_out = CONCAT44(in_register_00000084,inl);
  *outl = 0;
  if (ctx->enc_data[0x2d] == '\0') {
    i = 0;
    in_len_local = (size_t)in;
    in_local = (uint8_t *)outl;
    out_len_local = (int *)out;
    out_local = (uint8_t *)ctx;
    for (uStack_48 = 0; uStack_48 < bytes_out; uStack_48 = uStack_48 + 1) {
      num_bytes_resulting._7_1_ = *(uint8_t *)(in_len_local + uStack_48);
      iVar2 = (int)(char)num_bytes_resulting._7_1_;
      if (((1 < iVar2 - 9U) && (iVar2 != 0xd)) && (iVar2 != 0x20)) {
        if (out_local[0x34] != '\0') {
          out_local[0x35] = '\x01';
          return -1;
        }
        uVar1 = *(uint *)out_local;
        *(uint *)out_local = uVar1 + 1;
        out_local[(ulong)uVar1 + 4] = num_bytes_resulting._7_1_;
        if (*(int *)out_local == 4) {
          iVar2 = base64_decode_quad((uint8_t *)out_len_local,&local_58,out_local + 4);
          if (iVar2 == 0) {
            out_local[0x35] = '\x01';
            return -1;
          }
          out_local[0] = '\0';
          out_local[1] = '\0';
          out_local[2] = '\0';
          out_local[3] = '\0';
          i = local_58 + i;
          out_len_local = (int *)(local_58 + (long)out_len_local);
          if (local_58 < 3) {
            out_local[0x34] = '\x01';
          }
        }
      }
    }
    if (i < 0x80000000) {
      *(int *)in_local = (int)i;
      if (out_local[0x34] == '\0') {
        ctx_local._4_4_ = 1;
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
    else {
      out_local[0x35] = '\x01';
      in_local[0] = '\0';
      in_local[1] = '\0';
      in_local[2] = '\0';
      in_local[3] = '\0';
      ctx_local._4_4_ = -1;
    }
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (ctx->error_encountered) {
    return -1;
  }

  size_t bytes_out = 0, i;
  for (i = 0; i < in_len; i++) {
    const char c = in[i];
    switch (c) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        continue;
    }

    if (ctx->eof_seen) {
      ctx->error_encountered = 1;
      return -1;
    }

    ctx->data[ctx->data_used++] = c;
    if (ctx->data_used == 4) {
      size_t num_bytes_resulting;
      if (!base64_decode_quad(out, &num_bytes_resulting, ctx->data)) {
        ctx->error_encountered = 1;
        return -1;
      }

      ctx->data_used = 0;
      bytes_out += num_bytes_resulting;
      out += num_bytes_resulting;

      if (num_bytes_resulting < 3) {
        ctx->eof_seen = 1;
      }
    }
  }

  if (bytes_out > INT_MAX) {
    ctx->error_encountered = 1;
    *out_len = 0;
    return -1;
  }
  *out_len = (int)bytes_out;

  if (ctx->eof_seen) {
    return 0;
  }

  return 1;
}